

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int erkStep_ComputeSolutions(ARKodeMem ark_mem,sunrealtype *dsmPtr)

{
  void *pvVar1;
  N_Vector p_Var2;
  N_Vector p_Var3;
  long lVar4;
  long lVar5;
  int iVar6;
  undefined8 *in_RSI;
  ARKodeMem in_RDI;
  undefined8 uVar7;
  ARKodeERKStepMem step_mem;
  N_Vector *Xvecs;
  sunrealtype *cvals;
  N_Vector yerr;
  N_Vector y;
  int nvec;
  int j;
  int retval;
  int local_24;
  int local_20;
  int local_4;
  
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError(in_RDI,-0x15,0x3e3,"erkStep_ComputeSolutions",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                    ,"Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    pvVar1 = in_RDI->step_mem;
    p_Var2 = in_RDI->ycur;
    p_Var3 = in_RDI->tempv1;
    lVar4 = *(long *)((long)pvVar1 + 0x30);
    lVar5 = *(long *)((long)pvVar1 + 0x38);
    *in_RSI = 0;
    local_24 = 0;
    for (local_20 = 0; local_20 < *(int *)((long)pvVar1 + 0x18); local_20 = local_20 + 1) {
      *(double *)(lVar4 + (long)local_24 * 8) =
           in_RDI->h *
           *(double *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 0x20) + (long)local_20 * 8);
      *(undefined8 *)(lVar5 + (long)local_24 * 8) =
           *(undefined8 *)(*(long *)((long)pvVar1 + 8) + (long)local_20 * 8);
      local_24 = local_24 + 1;
    }
    *(undefined8 *)(lVar4 + (long)local_24 * 8) = 0x3ff0000000000000;
    *(N_Vector *)(lVar5 + (long)local_24 * 8) = in_RDI->yn;
    iVar6 = N_VLinearCombination(local_24 + 1,lVar4,lVar5,p_Var2);
    if (iVar6 == 0) {
      if (in_RDI->fixedstep == 0) {
        local_24 = 0;
        for (local_20 = 0; local_20 < *(int *)((long)pvVar1 + 0x18); local_20 = local_20 + 1) {
          *(double *)(lVar4 + (long)local_24 * 8) =
               in_RDI->h *
               (*(double *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 0x20) + (long)local_20 * 8) -
               *(double *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 0x28) + (long)local_20 * 8));
          *(undefined8 *)(lVar5 + (long)local_24 * 8) =
               *(undefined8 *)(*(long *)((long)pvVar1 + 8) + (long)local_20 * 8);
          local_24 = local_24 + 1;
        }
        iVar6 = N_VLinearCombination(local_24,lVar4,lVar5,p_Var3);
        if (iVar6 != 0) {
          return -0x1c;
        }
        uVar7 = N_VWrmsNorm(p_Var3,in_RDI->ewt);
        *in_RSI = uVar7;
      }
      local_4 = 0;
    }
    else {
      local_4 = -0x1c;
    }
  }
  return local_4;
}

Assistant:

int erkStep_ComputeSolutions(ARKodeMem ark_mem, sunrealtype* dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  ARKodeERKStepMem step_mem;

  /* access ARKodeERKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ERKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeERKStepMem)ark_mem->step_mem;

  /* set N_Vector shortcuts */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;

  /* Compute time step solution */
  /*   set arrays for fused vector operation */
  nvec = 0;
  for (j = 0; j < step_mem->stages; j++)
  {
    cvals[nvec] = ark_mem->h * step_mem->B->b[j];
    Xvecs[nvec] = step_mem->F[j];
    nvec += 1;
  }
  cvals[nvec] = ONE;
  Xvecs[nvec] = ark_mem->yn;
  nvec += 1;

  /*   call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep)
  {
    /* set arrays for fused vector operation */
    nvec = 0;
    for (j = 0; j < step_mem->stages; j++)
    {
      cvals[nvec] = ark_mem->h * (step_mem->B->b[j] - step_mem->B->d[j]);
      Xvecs[nvec] = step_mem->F[j];
      nvec += 1;
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return (ARK_SUCCESS);
}